

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O1

uint __thiscall
Parse::TPTP::addOverloadedFunction
          (TPTP *this,string *name,int arity,int symbolArity,bool *added,TermList *arg,
          Interpretation integer,Interpretation rational,Interpretation real)

{
  Signature *this_00;
  TermList __lhs;
  TermList TVar1;
  OperatorType *type;
  undefined8 *puVar2;
  long *plVar3;
  size_type *psVar4;
  long *plVar5;
  int i;
  TermList *pTVar6;
  uint uVar7;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  TermList in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  Interpretation local_17c;
  string local_178;
  long *local_158;
  long local_150;
  long local_148;
  long lStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  long *local_118 [2];
  long local_108 [2];
  long *local_f8;
  long local_f0;
  long local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  long *local_d8;
  long local_d0;
  long local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  string local_98;
  string local_78;
  string local_58;
  TermList local_38;
  
  if (arity != symbolArity) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+(name,(char *)in_stack_fffffffffffffe30._content);
    ::Lib::Int::toString_abi_cxx11_(&local_178,(Int *)(ulong)(uint)arity,i);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe30._content,in_stack_fffffffffffffe28);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_158);
    local_1c0._M_dataplus._M_p = (pointer)*plVar3;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)local_1c0._M_dataplus._M_p == psVar4) {
      local_1c0.field_2._M_allocated_capacity = *psVar4;
      local_1c0.field_2._8_8_ = plVar3[3];
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *psVar4;
    }
    local_1c0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ::Lib::Int::toString_abi_cxx11_
              (&local_138,(Int *)(ulong)(uint)symbolArity,(int)local_1c0._M_string_length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe30._content,in_stack_fffffffffffffe28);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    local_d8 = (long *)*plVar3;
    plVar5 = plVar3 + 2;
    if (local_d8 == plVar5) {
      local_c8 = *plVar5;
      uStack_c0 = (undefined4)plVar3[3];
      uStack_bc = *(undefined4 *)((long)plVar3 + 0x1c);
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar5;
    }
    local_d0 = plVar3[1];
    *plVar3 = (long)plVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    *puVar2 = &PTR_cry_00b69f40;
    puVar2[1] = puVar2 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar2 + 1),local_d8,local_d0 + (long)local_d8);
    *puVar2 = &PTR_cry_00b6a028;
    *(undefined4 *)(puVar2 + 5) = 0;
    puVar2[6] = puVar2 + 8;
    puVar2[7] = 0;
    *(undefined1 *)(puVar2 + 8) = 0;
    __cxa_throw(puVar2,&::Lib::UserErrorException::typeinfo,
                ::Lib::UserErrorException::~UserErrorException);
  }
  local_17c = real;
  __lhs = sortOf(this,arg->_content);
  if (1 < arity) {
    pTVar6 = arg + -1;
    uVar7 = 1;
    do {
      TVar1 = sortOf(this,pTVar6->_content);
      if (TVar1._content != __lhs._content) {
        std::operator+(&local_1c0,"The interpreted function symbol ",name);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_1a0._M_dataplus._M_p = (pointer)*plVar3;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_1a0._M_dataplus._M_p == psVar4) {
          local_1a0.field_2._M_allocated_capacity = *psVar4;
          local_1a0.field_2._8_8_ = plVar3[3];
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar4;
        }
        local_1a0._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        Kernel::TermList::toString_abi_cxx11_(&local_58,(TermList *)&stack0xfffffffffffffe30,false);
        std::operator+(&local_138,"\nArgument 0 is ",&local_58);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_178._M_dataplus._M_p = (pointer)*plVar3;
        psVar4 = (size_type *)(plVar3 + 2);
        if ((size_type *)local_178._M_dataplus._M_p == psVar4) {
          local_178.field_2._M_allocated_capacity = *psVar4;
          local_178.field_2._8_8_ = plVar3[3];
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        }
        else {
          local_178.field_2._M_allocated_capacity = *psVar4;
        }
        local_178._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        ::Lib::Int::toString_abi_cxx11_
                  (&local_78,(Int *)(ulong)uVar7,(int)local_178._M_string_length);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __lhs._content,in_stack_fffffffffffffe28);
        plVar3 = (long *)std::__cxx11::string::append((char *)local_118);
        local_158 = (long *)*plVar3;
        plVar5 = plVar3 + 2;
        if (local_158 == plVar5) {
          local_148 = *plVar5;
          lStack_140 = plVar3[3];
          local_158 = &local_148;
        }
        else {
          local_148 = *plVar5;
        }
        local_150 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        local_38 = sortOf(this,pTVar6->_content);
        Kernel::TermList::toString_abi_cxx11_(&local_98,&local_38,false);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __lhs._content,in_stack_fffffffffffffe28);
        std::__cxx11::string::_M_append((char *)&local_1a0,(ulong)local_1c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (local_158 != &local_148) {
          operator_delete(local_158,local_148 + 1);
        }
        if (local_118[0] != local_108) {
          operator_delete(local_118[0],local_108[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x50);
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,local_1a0._M_dataplus._M_p,
                   local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
        *puVar2 = &PTR_cry_00b69f40;
        puVar2[1] = puVar2 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar2 + 1),local_b8,local_b8 + local_b0);
        *puVar2 = &PTR_cry_00b6a028;
        *(undefined4 *)(puVar2 + 5) = 0;
        puVar2[6] = puVar2 + 8;
        puVar2[7] = 0;
        *(undefined1 *)(puVar2 + 8) = 0;
        __cxa_throw(puVar2,&::Lib::UserErrorException::typeinfo,
                    ::Lib::UserErrorException::~UserErrorException);
      }
      uVar7 = uVar7 + 1;
      pTVar6 = pTVar6 + -1;
    } while (arity != uVar7);
  }
  TVar1 = Kernel::AtomicSort::intSort();
  if (__lhs._content != TVar1._content) {
    TVar1 = Kernel::AtomicSort::rationalSort();
    integer = rational;
    if (__lhs._content != TVar1._content) {
      TVar1 = Kernel::AtomicSort::realSort();
      integer = local_17c;
      if (__lhs._content != TVar1._content) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x50);
        std::operator+(&local_1a0,"The symbol ",name);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_1a0);
        local_f8 = (long *)*plVar3;
        plVar5 = plVar3 + 2;
        if (local_f8 == plVar5) {
          local_e8 = *plVar5;
          uStack_e0 = (undefined4)plVar3[3];
          uStack_dc = *(undefined4 *)((long)plVar3 + 0x1c);
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *plVar5;
        }
        local_f0 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        *puVar2 = &PTR_cry_00b69f40;
        puVar2[1] = puVar2 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar2 + 1),local_f8,local_f0 + (long)local_f8);
        *puVar2 = &PTR_cry_00b6a028;
        *(undefined4 *)(puVar2 + 5) = 0;
        puVar2[6] = puVar2 + 8;
        puVar2[7] = 0;
        *(undefined1 *)(puVar2 + 8) = 0;
        __cxa_throw(puVar2,&::Lib::UserErrorException::typeinfo,
                    ::Lib::UserErrorException::~UserErrorException);
      }
    }
  }
  this_00 = DAT_00b7e1b0;
  type = Kernel::Theory::getNonpolymorphicOperatorType(integer);
  uVar7 = Kernel::Signature::addInterpretedFunction(this_00,integer,type,name);
  return uVar7;
}

Assistant:

unsigned TPTP::addOverloadedFunction(std::string name,int arity,int symbolArity,bool& added,TermList& arg,
				     Theory::Interpretation integer,Theory::Interpretation rational,
				     Theory::Interpretation real)
{
  if (arity != symbolArity) {
    USER_ERROR(name + " is used with " + Int::toString(arity) + " argument(s) when there were "+Int::toString(symbolArity)+" expected");
  }
  TermList srt = sortOf(arg);
  TermList* n = arg.next();
  for(int i=1;i<arity;i++){
    if(sortOf(*n)!=srt){
      std::string msg = "The interpreted function symbol " + name + " is not used with a single sort.";
      msg += "\nArgument 0 is "+srt.toString()+" and argument "+Lib::Int::toString(i)+" is "+sortOf(*n).toString();
      USER_ERROR(msg);
    }
    n = n->next();
  }
  if (srt == AtomicSort::intSort()) {
    return env.signature->addInterpretedFunction(integer,name);
  }
  if (srt == AtomicSort::rationalSort()) {
    return env.signature->addInterpretedFunction(rational,name);
  }
  if (srt == AtomicSort::realSort()) {
    return env.signature->addInterpretedFunction(real,name);
  }
  USER_ERROR("The symbol " + name + " is used with a non-numeric type");
}